

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  undefined2 uVar1;
  byte bVar2;
  int a_00;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  stbi_uc *psVar9;
  ulong uVar11;
  int iVar12;
  stbi__uint32 sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  stbi_uc *psVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  byte *pbVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  byte *pbVar28;
  ulong uVar29;
  long lVar30;
  stbi_uc *psVar31;
  byte bVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  stbi_uc *psVar37;
  uint uVar38;
  ulong uVar39;
  bool bVar40;
  ulong local_60;
  ulong uVar10;
  
  bVar40 = depth == 0x10;
  a_00 = a->s->img_n;
  lVar24 = (long)a_00;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar40,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar5 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      iVar5 = a_00 * x;
      uVar6 = iVar5 * depth + 7U >> 3;
      uVar10 = (ulong)uVar6;
      if ((uVar6 + 1) * y <= raw_len) {
        uVar7 = x * out_n;
        uVar8 = uVar7 << bVar40;
        if (y != 0) {
          uVar23 = a_00 << bVar40;
          uVar6 = uVar7 - uVar6;
          if (7 < depth) {
            uVar6 = 0;
          }
          uVar29 = (ulong)uVar6;
          uVar36 = (ulong)uVar8;
          lVar26 = -uVar36;
          lVar21 = (long)(out_n << bVar40);
          iVar12 = x - 1;
          lVar27 = uVar29 - lVar21;
          lVar30 = uVar29 - uVar36;
          uVar16 = 0;
          uVar39 = 0;
          local_60 = (ulong)x;
          do {
            pbVar28 = raw + 1;
            bVar3 = *raw;
            uVar11 = (ulong)bVar3;
            if (uVar11 < 5) {
              if (depth < 8) {
                local_60 = uVar10;
                uVar23 = 1;
              }
              if (uVar39 == 0) {
                uVar11 = (ulong)""[uVar11];
              }
              psVar9 = a->out;
              if (0 < (int)uVar23) {
                lVar17 = lVar26 + uVar16 + uVar29;
                uVar33 = 0;
                do {
                  switch(uVar11) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar4 = pbVar28[uVar33];
                    goto LAB_0032c4c5;
                  case 2:
                  case 4:
                    bVar4 = psVar9[uVar33 + lVar17];
                    break;
                  case 3:
                    bVar4 = psVar9[uVar33 + lVar17] >> 1;
                    break;
                  default:
                    goto switchD_0032c4ab_default;
                  }
                  bVar4 = bVar4 + pbVar28[uVar33];
LAB_0032c4c5:
                  psVar9[uVar33 + uVar16 + uVar29] = bVar4;
switchD_0032c4ab_default:
                  uVar33 = uVar33 + 1;
                } while (uVar23 != uVar33);
              }
              lVar17 = uVar8 * (int)uVar39 + uVar29;
              if (depth == 8) {
                lVar15 = (long)out_n;
                lVar14 = lVar24;
                if (a_00 != out_n) {
                  psVar9[lVar24 + lVar17] = 0xff;
                }
LAB_0032c541:
                pbVar28 = pbVar28 + lVar14;
              }
              else {
                if (depth == 0x10) {
                  lVar14 = (long)(int)uVar23;
                  lVar15 = lVar21;
                  if (a_00 != out_n) {
                    (psVar9 + lVar14 + lVar17)[0] = 0xff;
                    (psVar9 + lVar14 + lVar17)[1] = 0xff;
                  }
                  goto LAB_0032c541;
                }
                pbVar28 = raw + 2;
                lVar15 = 1;
              }
              psVar37 = psVar9 + lVar15 + lVar17;
              if (a_00 == out_n || depth < 8) {
                uVar6 = ((int)local_60 + -1) * uVar23;
                switch(uVar11) {
                case 0:
                  memcpy(psVar37,pbVar28,(long)(int)uVar6);
                  break;
                case 1:
                  if (0 < (int)uVar6) {
                    uVar11 = 0;
                    do {
                      psVar9[uVar11 + lVar15 + uVar16 + uVar29] =
                           psVar9[uVar11 + ((lVar15 + uVar16) - (long)(int)uVar23) + uVar29] +
                           pbVar28[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar6 != uVar11);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar6) {
                    lVar17 = lVar15 + uVar16 + uVar29;
                    uVar11 = 0;
                    do {
                      psVar9[uVar11 + lVar17] = psVar9[uVar11 + lVar26 + lVar17] + pbVar28[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar6 != uVar11);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar6) {
                    lVar15 = lVar15 + uVar16;
                    uVar11 = 0;
                    do {
                      psVar9[uVar11 + lVar15 + uVar29] =
                           (char)((uint)psVar9[uVar11 + (lVar15 - (int)uVar23) + uVar29] +
                                  (uint)psVar9[uVar11 + lVar15 + lVar30] >> 1) + pbVar28[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar6 != uVar11);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar6) {
                    lVar15 = lVar15 + uVar16;
                    uVar11 = 0;
                    do {
                      bVar4 = psVar9[uVar11 + (lVar15 - (int)uVar23) + uVar29];
                      bVar2 = psVar9[uVar11 + lVar15 + lVar30];
                      bVar32 = psVar9[uVar11 + (lVar15 - (int)uVar23) + lVar30];
                      iVar34 = ((uint)bVar2 + (uint)bVar4) - (uint)bVar32;
                      uVar19 = iVar34 - (uint)bVar4;
                      uVar20 = -uVar19;
                      if (0 < (int)uVar19) {
                        uVar20 = uVar19;
                      }
                      uVar38 = iVar34 - (uint)bVar2;
                      uVar19 = -uVar38;
                      if (0 < (int)uVar38) {
                        uVar19 = uVar38;
                      }
                      uVar35 = iVar34 - (uint)bVar32;
                      uVar38 = -uVar35;
                      if (0 < (int)uVar35) {
                        uVar38 = uVar35;
                      }
                      if (uVar19 <= uVar38) {
                        bVar32 = bVar2;
                      }
                      if (uVar38 < uVar20) {
                        bVar4 = bVar32;
                      }
                      if (uVar19 < uVar20) {
                        bVar4 = bVar32;
                      }
                      psVar9[uVar11 + lVar15 + uVar29] = bVar4 + pbVar28[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar6 != uVar11);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar6) {
                    uVar11 = 0;
                    do {
                      psVar9[uVar11 + lVar15 + uVar16 + uVar29] =
                           (psVar9[uVar11 + ((lVar15 + uVar16) - (long)(int)uVar23) + uVar29] >> 1)
                           + pbVar28[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar6 != uVar11);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar6) {
                    uVar11 = 0;
                    do {
                      psVar9[uVar11 + lVar15 + uVar16 + uVar29] =
                           psVar9[uVar11 + ((lVar15 + uVar16) - (long)(int)uVar23) + uVar29] +
                           pbVar28[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar6 != uVar11);
                  }
                }
                pbVar28 = pbVar28 + (int)uVar6;
              }
              else {
                if ((byte)uVar11 < 7) {
                  psVar18 = psVar9 + lVar15 + lVar26 + lVar17;
                  switch(uVar11) {
                  case 0:
                    if (iVar12 != 0) {
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            psVar37[uVar11] = pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    break;
                  case 1:
                    if (iVar12 != 0) {
                      psVar9 = psVar9 + lVar15 + uVar16 + lVar27;
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            psVar37[uVar11] = psVar9[uVar11] + pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        psVar9 = psVar9 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    break;
                  case 2:
                    if (iVar12 != 0) {
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            psVar37[uVar11] = psVar37[uVar11 + lVar26] + pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    break;
                  case 3:
                    if (iVar12 != 0) {
                      psVar9 = psVar9 + lVar15 + uVar16 + lVar27;
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            psVar37[uVar11] =
                                 (char)((uint)psVar9[uVar11] + (uint)psVar18[uVar11] >> 1) +
                                 pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        psVar18 = psVar18 + lVar21;
                        psVar9 = psVar9 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    break;
                  case 4:
                    if (iVar12 != 0) {
                      psVar31 = psVar9 + lVar15 + uVar16 + lVar27;
                      psVar9 = psVar9 + lVar15 + uVar16 + (lVar27 - uVar36);
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            bVar4 = psVar31[uVar11];
                            bVar2 = psVar18[uVar11];
                            bVar32 = psVar9[uVar11];
                            iVar25 = ((uint)bVar2 + (uint)bVar4) - (uint)bVar32;
                            uVar20 = iVar25 - (uint)bVar4;
                            uVar6 = -uVar20;
                            if (0 < (int)uVar20) {
                              uVar6 = uVar20;
                            }
                            uVar19 = iVar25 - (uint)bVar2;
                            uVar20 = -uVar19;
                            if (0 < (int)uVar19) {
                              uVar20 = uVar19;
                            }
                            uVar38 = iVar25 - (uint)bVar32;
                            uVar19 = -uVar38;
                            if (0 < (int)uVar38) {
                              uVar19 = uVar38;
                            }
                            if (uVar20 <= uVar19) {
                              bVar32 = bVar2;
                            }
                            if (uVar19 < uVar6) {
                              bVar4 = bVar32;
                            }
                            if (uVar20 < uVar6) {
                              bVar4 = bVar32;
                            }
                            psVar37[uVar11] = bVar4 + pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        psVar18 = psVar18 + lVar21;
                        psVar31 = psVar31 + lVar21;
                        psVar9 = psVar9 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    break;
                  case 5:
                    if (iVar12 != 0) {
                      psVar9 = psVar9 + lVar15 + uVar16 + lVar27;
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            psVar37[uVar11] = (psVar9[uVar11] >> 1) + pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        psVar9 = psVar9 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    break;
                  case 6:
                    if (iVar12 != 0) {
                      psVar9 = psVar9 + lVar15 + uVar16 + lVar27;
                      iVar34 = iVar12;
                      do {
                        if (0 < (int)uVar23) {
                          uVar11 = 0;
                          do {
                            psVar37[uVar11] = psVar9[uVar11] + pbVar28[uVar11];
                            uVar11 = uVar11 + 1;
                          } while (uVar23 != uVar11);
                        }
                        psVar37[(int)uVar23] = 0xff;
                        pbVar28 = pbVar28 + (int)uVar23;
                        psVar37 = psVar37 + lVar21;
                        psVar9 = psVar9 + lVar21;
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar9 = a->out + (long)(int)uVar23 + uVar16 + 1;
                  sVar13 = x;
                  do {
                    *psVar9 = 0xff;
                    psVar9 = psVar9 + lVar21;
                    sVar13 = sVar13 - 1;
                  } while (sVar13 != 0);
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar3) {
              return 0;
            }
            uVar39 = uVar39 + 1;
            uVar16 = (ulong)((int)uVar16 + uVar8);
            raw = pbVar28;
          } while (uVar39 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar7 * y != 0) {
            psVar9 = a->out;
            lVar24 = 0;
            do {
              uVar1 = swap_bytes(*(undefined2 *)(psVar9 + lVar24 * 2));
              *(undefined2 *)(psVar9 + lVar24 * 2) = uVar1;
              lVar24 = lVar24 + 1;
            } while (uVar7 * y != (int)lVar24);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar6 = x - 1;
        lVar24 = uVar7 - uVar10;
        lVar21 = (ulong)uVar6 + 1;
        uVar23 = 0;
        uVar36 = 0;
        do {
          bVar3 = 1;
          if (color == 0) {
            bVar3 = ""[depth];
          }
          psVar9 = a->out;
          pbVar22 = psVar9 + uVar8 * (int)uVar36;
          pbVar28 = pbVar22 + (uVar7 - uVar10);
          uVar16 = (ulong)uVar23;
          if (depth == 4) {
            iVar12 = iVar5;
            if (1 < iVar5) {
              psVar37 = psVar9 + lVar24;
              iVar34 = iVar5;
              do {
                psVar9[uVar16] = (psVar37[uVar16] >> 4) * bVar3;
                psVar9[uVar16 + 1] = (psVar37[uVar16] & 0xf) * bVar3;
                iVar12 = iVar34 + -2;
                psVar37 = psVar37 + 1;
                psVar9 = psVar9 + 2;
                bVar40 = 3 < iVar34;
                iVar34 = iVar12;
              } while (bVar40);
              pbVar28 = psVar37 + uVar16;
              pbVar22 = psVar9 + uVar16;
            }
            if (iVar12 == 1) {
              bVar4 = *pbVar28 >> 4;
LAB_0032ce62:
              bVar3 = bVar4 * bVar3;
LAB_0032ce65:
              *pbVar22 = bVar3;
            }
          }
          else if (depth == 2) {
            iVar12 = iVar5;
            if (3 < iVar5) {
              psVar37 = psVar9 + lVar24;
              iVar34 = iVar5;
              do {
                psVar9[uVar16] = (psVar37[uVar16] >> 6) * bVar3;
                psVar9[uVar16 + 1] = (psVar37[uVar16] >> 4 & 3) * bVar3;
                psVar9[uVar16 + 2] = (psVar37[uVar16] >> 2 & 3) * bVar3;
                psVar9[uVar16 + 3] = (psVar37[uVar16] & 3) * bVar3;
                iVar12 = iVar34 + -4;
                psVar37 = psVar37 + 1;
                psVar9 = psVar9 + 4;
                bVar40 = 7 < iVar34;
                iVar34 = iVar12;
              } while (bVar40);
              pbVar28 = psVar37 + uVar16;
              pbVar22 = psVar9 + uVar16;
            }
            if (0 < iVar12) {
              *pbVar22 = (*pbVar28 >> 6) * bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (1 < iVar12) {
              *pbVar22 = (*pbVar28 >> 4 & 3) * bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (iVar12 == 3) {
              bVar4 = *pbVar28 >> 2 & 3;
              goto LAB_0032ce62;
            }
          }
          else if (depth == 1) {
            iVar12 = iVar5;
            if (7 < iVar5) {
              psVar37 = psVar9 + lVar24;
              iVar34 = iVar5;
              do {
                psVar9[uVar16] = (char)psVar37[uVar16] >> 7 & bVar3;
                psVar9[uVar16 + 1] = (char)(psVar37[uVar16] * '\x02') >> 7 & bVar3;
                psVar9[uVar16 + 2] = (char)(psVar37[uVar16] << 2) >> 7 & bVar3;
                psVar9[uVar16 + 3] = (char)(psVar37[uVar16] << 3) >> 7 & bVar3;
                psVar9[uVar16 + 4] = (char)(psVar37[uVar16] << 4) >> 7 & bVar3;
                psVar9[uVar16 + 5] = (char)(psVar37[uVar16] << 5) >> 7 & bVar3;
                psVar9[uVar16 + 6] = (char)(psVar37[uVar16] << 6) >> 7 & bVar3;
                bVar4 = bVar3;
                if ((psVar37[uVar16] & 1) == 0) {
                  bVar4 = 0;
                }
                psVar9[uVar16 + 7] = bVar4;
                iVar12 = iVar34 + -8;
                psVar37 = psVar37 + 1;
                psVar9 = psVar9 + 8;
                bVar40 = 0xf < iVar34;
                iVar34 = iVar12;
              } while (bVar40);
              pbVar28 = psVar37 + uVar16;
              pbVar22 = psVar9 + uVar16;
            }
            if (0 < iVar12) {
              *pbVar22 = (char)*pbVar28 >> 7 & bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (1 < iVar12) {
              *pbVar22 = (char)(*pbVar28 * '\x02') >> 7 & bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (2 < iVar12) {
              *pbVar22 = (char)(*pbVar28 << 2) >> 7 & bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (3 < iVar12) {
              *pbVar22 = (char)(*pbVar28 << 3) >> 7 & bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (4 < iVar12) {
              *pbVar22 = (char)(*pbVar28 << 4) >> 7 & bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (5 < iVar12) {
              *pbVar22 = (char)(*pbVar28 << 5) >> 7 & bVar3;
              pbVar22 = pbVar22 + 1;
            }
            if (iVar12 == 7) {
              bVar3 = (char)(*pbVar28 << 6) >> 7 & bVar3;
              goto LAB_0032ce65;
            }
          }
          if (a_00 != out_n) {
            psVar9 = a->out;
            if (a_00 == 1) {
              lVar26 = lVar21;
              if (-1 < (int)uVar6) {
                do {
                  psVar9[lVar26 * 2 + (uVar16 - 1)] = 0xff;
                  psVar9[lVar26 * 2 + (uVar16 - 2)] = psVar9[lVar26 + (uVar16 - 1)];
                  lVar27 = lVar26 + -1;
                  bVar40 = 0 < lVar26;
                  lVar26 = lVar27;
                } while (lVar27 != 0 && bVar40);
              }
            }
            else if (-1 < (int)uVar6) {
              psVar37 = psVar9 + (ulong)uVar6 * 3 + 2 + uVar16;
              lVar26 = lVar21;
              do {
                psVar9[lVar26 * 4 + (uVar16 - 1)] = 0xff;
                psVar9[lVar26 * 4 + (uVar16 - 2)] = *psVar37;
                psVar9[lVar26 * 4 + (uVar16 - 3)] = psVar37[-1];
                psVar9[lVar26 * 4 + (uVar16 - 4)] = psVar37[-2];
                psVar37 = psVar37 + -3;
                lVar27 = lVar26 + -1;
                bVar40 = 0 < lVar26;
                lVar26 = lVar27;
              } while (lVar27 != 0 && bVar40);
            }
          }
          uVar36 = uVar36 + 1;
          uVar23 = uVar23 + uVar8;
          if (uVar36 == y) {
            return 1;
          }
        } while( true );
      }
      stbi__g_failure_reason = "not enough pixels";
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }